

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

VkResult vmaInvalidateAllocations
                   (VmaAllocator allocator,uint32_t allocationCount,VmaAllocation *allocations,
                   VkDeviceSize *offsets,VkDeviceSize *sizes)

{
  int in_ESI;
  VkResult res;
  VMA_CACHE_OPERATION in_stack_0000035c;
  VkDeviceSize *in_stack_00000360;
  VkDeviceSize *in_stack_00000368;
  VmaAllocation *in_stack_00000370;
  uint32_t in_stack_0000037c;
  VmaAllocator_T *in_stack_00000380;
  undefined4 local_4;
  
  if (in_ESI == 0) {
    local_4 = VK_SUCCESS;
  }
  else {
    local_4 = VmaAllocator_T::FlushOrInvalidateAllocations
                        (in_stack_00000380,in_stack_0000037c,in_stack_00000370,in_stack_00000368,
                         in_stack_00000360,in_stack_0000035c);
  }
  return local_4;
}

Assistant:

VMA_CALL_PRE VkResult VMA_CALL_POST vmaInvalidateAllocations(
    VmaAllocator allocator,
    uint32_t allocationCount,
    const VmaAllocation* allocations,
    const VkDeviceSize* offsets,
    const VkDeviceSize* sizes)
{
    VMA_ASSERT(allocator);

    if(allocationCount == 0)
    {
        return VK_SUCCESS;
    }

    VMA_ASSERT(allocations);

    VMA_DEBUG_LOG("vmaInvalidateAllocations");

    VMA_DEBUG_GLOBAL_MUTEX_LOCK

    const VkResult res = allocator->FlushOrInvalidateAllocations(allocationCount, allocations, offsets, sizes, VMA_CACHE_INVALIDATE);

    return res;
}